

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O1

DdNode * cuddBddVectorComposeRecur
                   (DdManager *dd,DdHashTable *table,DdNode *f,DdNode **vector,int deepest)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *value;
  DdNode *f_00;
  
  f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  iVar2 = 0x7fffffff;
  if ((ulong)f_00->index != 0x7fffffff) {
    iVar2 = dd->perm[f_00->index];
  }
  if (iVar2 <= deepest) {
    pDVar3 = cuddHashTableLookup1(table,f_00);
    if (pDVar3 == (DdNode *)0x0) {
      pDVar3 = cuddBddVectorComposeRecur(dd,table,(f_00->type).kids.T,vector,deepest);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        h = cuddBddVectorComposeRecur(dd,table,(f_00->type).kids.E,vector,deepest);
        value = pDVar3;
        if (h != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          value = cuddBddIteRecur(dd,vector[f_00->index],pDVar3,h);
          if (value == (DdNode *)0x0) {
            Cudd_IterDerefBdd(dd,pDVar3);
            value = h;
          }
          else {
            piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_IterDerefBdd(dd,pDVar3);
            Cudd_IterDerefBdd(dd,h);
            if (((ulong)f_00->ref == 1) ||
               (iVar2 = cuddHashTableInsert1(table,f_00,value,(ulong)f_00->ref - 1), iVar2 != 0)) {
              piVar1 = (int *)(((ulong)value & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + -1;
              return (DdNode *)((ulong)value ^ (ulong)(f_00 != f));
            }
          }
        }
        Cudd_IterDerefBdd(dd,value);
      }
      f = (DdNode *)0x0;
    }
    else {
      f = (DdNode *)((ulong)pDVar3 ^ (ulong)(f_00 != f));
    }
  }
  return f;
}

Assistant:

static DdNode *
cuddBddVectorComposeRecur(
  DdManager * dd /* DD manager */,
  DdHashTable * table /* computed table */,
  DdNode * f /* BDD in which to compose */,
  DdNode ** vector /* functions to be composed */,
  int deepest /* depth of the deepest substitution */)
{
    DdNode      *F,*T,*E;
    DdNode      *res;

    statLine(dd);
    F = Cudd_Regular(f);

    /* If we are past the deepest substitution, return f. */
    if (cuddI(dd,F->index) > deepest) {
        return(f);
    }

    /* If problem already solved, look up answer and return. */
    if ((res = cuddHashTableLookup1(table,F)) != NULL) {
#ifdef DD_DEBUG
        bddVectorComposeHits++;
#endif
        return(Cudd_NotCond(res,F != f));
    }

    /* Split and recur on children of this node. */
    T = cuddBddVectorComposeRecur(dd,table,cuddT(F),vector, deepest);
    if (T == NULL) return(NULL);
    cuddRef(T);
    E = cuddBddVectorComposeRecur(dd,table,cuddE(F),vector, deepest);
    if (E == NULL) {
        Cudd_IterDerefBdd(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* Call cuddBddIteRecur with the BDD that replaces the current top
    ** variable and the T and E we just created.
    */
    res = cuddBddIteRecur(dd,vector[F->index],T,E);
    if (res == NULL) {
        Cudd_IterDerefBdd(dd, T);
        Cudd_IterDerefBdd(dd, E);
        return(NULL);
    }
    cuddRef(res);
    Cudd_IterDerefBdd(dd, T);
    Cudd_IterDerefBdd(dd, E);   

    /* Do not keep the result if the reference count is only 1, since
    ** it will not be visited again.
    */
    if (F->ref != 1) {
        ptrint fanout = (ptrint) F->ref;
        cuddSatDec(fanout);
        if (!cuddHashTableInsert1(table,F,res,fanout)) {
            Cudd_IterDerefBdd(dd, res);
            return(NULL);
        }
    }
    cuddDeref(res);
    return(Cudd_NotCond(res,F != f));

}